

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  XML_UnknownEncodingHandler p_Var1;
  _func_void_ptr_size_t *p_Var2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  ENCODING *pEVar6;
  XML_Error XVar7;
  code *pcVar8;
  XML_Encoding local_440;
  
  p_Var1 = parser->m_unknownEncodingHandler;
  if (p_Var1 == (XML_UnknownEncodingHandler)0x0) {
    return XML_ERROR_UNKNOWN_ENCODING;
  }
  memset(&local_440,0xff,0x400);
  local_440.data = (void *)0x0;
  local_440.convert = (_func_int_void_ptr_char_ptr *)0x0;
  local_440.release = (_func_void_void_ptr *)0x0;
  iVar4 = (*p_Var1)(parser->m_unknownEncodingHandlerData,encodingName,&local_440);
  if (iVar4 != 0) {
    p_Var2 = (parser->m_mem).malloc_fcn;
    iVar4 = coda_XmlSizeOfUnknownEncoding();
    pvVar5 = (*p_Var2)((long)iVar4);
    parser->m_unknownEncodingMem = pvVar5;
    if (pvVar5 == (void *)0x0) {
      parser = (XML_Parser)0x1;
      if (local_440.release != (_func_void_void_ptr *)0x0) {
        (*local_440.release)(local_440.data);
      }
LAB_0016f0e9:
      bVar3 = false;
    }
    else {
      if (parser->m_ns == '\0') {
        pcVar8 = coda_XmlInitUnknownEncoding;
      }
      else {
        pcVar8 = coda_XmlInitUnknownEncodingNS;
      }
      pEVar6 = (ENCODING *)(*pcVar8)(pvVar5,&local_440,local_440.convert,local_440.data);
      if (pEVar6 != (ENCODING *)0x0) {
        parser->m_unknownEncodingData = local_440.data;
        parser->m_unknownEncodingRelease = local_440.release;
        parser->m_encoding = pEVar6;
        parser = (XML_Parser)0x0;
        goto LAB_0016f0e9;
      }
      bVar3 = true;
    }
    XVar7 = (XML_Error)parser;
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0016f111;
    }
  }
  XVar7 = (XML_Error)parser;
  bVar3 = true;
  if (local_440.release != (_func_void_void_ptr *)0x0) {
    (*local_440.release)(local_440.data);
  }
LAB_0016f111:
  if (bVar3) {
    return XML_ERROR_UNKNOWN_ENCODING;
  }
  return XVar7;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName) {
  if (parser->m_unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = NULL;
    info.data = NULL;
    info.release = NULL;
    if (parser->m_unknownEncodingHandler(parser->m_unknownEncodingHandlerData,
                                         encodingName, &info)) {
      ENCODING *enc;
      parser->m_unknownEncodingMem = MALLOC(parser, XmlSizeOfUnknownEncoding());
      if (! parser->m_unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (parser->m_ns ? XmlInitUnknownEncodingNS : XmlInitUnknownEncoding)(
          parser->m_unknownEncodingMem, info.map, info.convert, info.data);
      if (enc) {
        parser->m_unknownEncodingData = info.data;
        parser->m_unknownEncodingRelease = info.release;
        parser->m_encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release != NULL)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}